

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiListClipper::End(ImGuiListClipper *this)

{
  float fVar1;
  float fVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiColumns *pIVar5;
  undefined8 uVar6;
  bool bVar7;
  ImGuiContext *pIVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  
  pIVar8 = GImGui;
  iVar3 = this->ItemsCount;
  if (-1 < iVar3) {
    if (iVar3 != 0x7fffffff) {
      auVar10._0_4_ = (float)iVar3;
      auVar10._4_12_ = in_ZMM0._4_12_;
      fVar1 = this->ItemsHeight;
      auVar10 = vfmadd213ss_fma(auVar10,ZEXT416((uint)fVar1),ZEXT416((uint)this->StartPosY));
      pIVar4 = GImGui->CurrentWindow;
      fVar9 = auVar10._0_4_;
      (pIVar4->DC).CursorPos.y = fVar9;
      fVar2 = (pIVar4->DC).CursorMaxPos.y;
      uVar6 = vcmpss_avx512f(auVar10,ZEXT416((uint)fVar2),2);
      bVar7 = (bool)((byte)uVar6 & 1);
      (pIVar4->DC).CursorMaxPos.y = (float)((uint)bVar7 * (int)fVar2 + (uint)!bVar7 * (int)fVar9);
      (pIVar4->DC).CursorPosPrevLine.y = fVar9 - fVar1;
      (pIVar4->DC).PrevLineSize.y = fVar1 - (pIVar8->Style).ItemSpacing.y;
      pIVar5 = (pIVar4->DC).CurrentColumns;
      if (pIVar5 != (ImGuiColumns *)0x0) {
        pIVar5->LineMinY = fVar9;
      }
    }
    this->ItemsCount = -1;
    this->StepNo = 3;
  }
  return;
}

Assistant:

void ImGuiListClipper::End()
{
    if (ItemsCount < 0)
        return;
    // In theory here we should assert that ImGui::GetCursorPosY() == StartPosY + DisplayEnd * ItemsHeight, but it feels saner to just seek at the end and not assert/crash the user.
    if (ItemsCount < INT_MAX)
        SetCursorPosYAndSetupDummyPrevLine(StartPosY + ItemsCount * ItemsHeight, ItemsHeight); // advance cursor
    ItemsCount = -1;
    StepNo = 3;
}